

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

ssize_t __thiscall
clask::response_writer::write(response_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,CONCAT44(in_register_00000034,__fd),
             (long)__buf + CONCAT44(in_register_00000034,__fd));
  (**this->_vptr_response_writer)(this,(string *)local_30);
  sVar1 = std::__cxx11::string::~string((string *)local_30);
  return sVar1;
}

Assistant:

inline void response_writer::write(char* buf, size_t n) {
  write(std::string(buf, n));
}